

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

bool chrono::geometry::InterpolateAndInsert
               (ChTriangleMeshConnected *mesh,int ibuffer,int i1,int i2,int *created_index)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  int iVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ChVector<double> Vnew;
  undefined1 local_28 [8];
  double dStack_20;
  double local_18;
  
  if (3 < (uint)ibuffer) {
    return false;
  }
  switch(ibuffer) {
  case 0:
    pCVar3 = (mesh->m_vertices).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar3 == (mesh->m_vertices).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    local_28 = (undefined1  [8])((pCVar3[i1].m_data[0] + pCVar3[i2].m_data[0]) * 0.5);
    dStack_20 = (pCVar3[i1].m_data[1] + pCVar3[i2].m_data[1]) * 0.5;
    local_18 = (pCVar3[i1].m_data[2] + pCVar3[i2].m_data[2]) * 0.5;
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (&mesh->m_vertices,(value_type *)local_28);
    uVar5 = (long)(mesh->m_vertices).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(mesh->m_vertices).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 1:
    pCVar3 = (mesh->m_normals).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar3 == (mesh->m_normals).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    local_28 = (undefined1  [8])((pCVar3[i1].m_data[0] + pCVar3[i2].m_data[0]) * 0.5);
    dStack_20 = (pCVar3[i1].m_data[1] + pCVar3[i2].m_data[1]) * 0.5;
    local_18 = (pCVar3[i1].m_data[2] + pCVar3[i2].m_data[2]) * 0.5;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dStack_20 * dStack_20;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = local_28;
    auVar7 = vfmadd231sd_fma(auVar7,auVar9,auVar9);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = local_18;
    auVar7 = vfmadd231sd_fma(auVar7,auVar8,auVar8);
    if (auVar7._0_8_ < 0.0) {
      dVar6 = sqrt(auVar7._0_8_);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar7,auVar7);
      dVar6 = auVar7._0_8_;
    }
    if (dVar6 < 2.2250738585072014e-308) {
      local_28 = (undefined1  [8])0x3ff0000000000000;
      dStack_20 = 0.0;
      local_18 = 0.0;
    }
    else {
      dVar6 = 1.0 / dVar6;
      local_28 = (undefined1  [8])(dVar6 * (double)local_28);
      dStack_20 = dVar6 * dStack_20;
      local_18 = dVar6 * local_18;
    }
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
              (&mesh->m_normals,(value_type *)local_28);
    uVar5 = (long)(mesh->m_normals).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(mesh->m_normals).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    break;
  case 2:
    pCVar1 = (mesh->m_UV).
             super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pCVar1 != (mesh->m_UV).
                  super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_28 = (undefined1  [8])((pCVar1[i1].m_data[0] + pCVar1[i2].m_data[0]) * 0.5);
      dStack_20 = (pCVar1[i1].m_data[1] + pCVar1[i2].m_data[1]) * 0.5;
      std::vector<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>::push_back
                (&mesh->m_UV,(value_type *)local_28);
      *created_index =
           (int)((ulong)((long)(mesh->m_UV).
                               super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(mesh->m_UV).
                              super__Vector_base<chrono::ChVector2<double>,_std::allocator<chrono::ChVector2<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
      return true;
    }
    return false;
  case 3:
    pCVar2 = (mesh->m_colors).super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pCVar2 == (mesh->m_colors).
                  super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      return false;
    }
    local_28._4_4_ = (pCVar2[i1].G + pCVar2[i2].G) * 0.5;
    local_28._0_4_ = (pCVar2[i1].R + pCVar2[i2].R) * 0.5;
    dStack_20 = (double)CONCAT44(dStack_20._4_4_,(pCVar2[i1].B + pCVar2[i2].B) * 0.5);
    std::vector<chrono::ChColor,_std::allocator<chrono::ChColor>_>::push_back
              (&mesh->m_colors,(value_type *)local_28);
    iVar4 = (int)((ulong)((long)(mesh->m_colors).
                                super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(mesh->m_colors).
                               super__Vector_base<chrono::ChColor,_std::allocator<chrono::ChColor>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2);
    goto LAB_0082877c;
  }
  iVar4 = (int)(uVar5 >> 3);
LAB_0082877c:
  *created_index = iVar4 * -0x55555555 + -1;
  return true;
}

Assistant:

bool InterpolateAndInsert(ChTriangleMeshConnected& mesh, int ibuffer, int i1, int i2, int& created_index) {
    switch (ibuffer) {
        case 0: {
            if (mesh.m_vertices.empty())
                return false;
            ChVector<> Vnew = (mesh.m_vertices[i1] + mesh.m_vertices[i2]) * 0.5;
            mesh.m_vertices.push_back(Vnew);
            created_index = (int)mesh.m_vertices.size() - 1;
            return true;
        }
        case 1: {
            if (mesh.m_normals.empty())
                return false;
            ChVector<> Vnew = (mesh.m_normals[i1] + mesh.m_normals[i2]) * 0.5;
            Vnew.Normalize();
            mesh.m_normals.push_back(Vnew);
            created_index = (int)mesh.m_normals.size() - 1;
            return true;
        }
        case 2: {
            if (mesh.m_UV.empty())
                return false;
            ChVector2<> Vnew = (mesh.m_UV[i1] + mesh.m_UV[i2]) * 0.5;
            mesh.m_UV.push_back(Vnew);
            created_index = (int)mesh.m_UV.size() - 1;
            return true;
        }
        case 3: {
            if (mesh.m_colors.empty())
                return false;
            ChColor Vnew = {(mesh.m_colors[i1].R + mesh.m_colors[i2].R) * 0.5f,
                            (mesh.m_colors[i1].G + mesh.m_colors[i2].G) * 0.5f,
                            (mesh.m_colors[i1].B + mesh.m_colors[i2].B) * 0.5f};
            mesh.m_colors.push_back(Vnew);
            created_index = (int)mesh.m_colors.size() - 1;
            return true;
        }
        default:
            return false;
    }
}